

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autosolve.cpp
# Opt level: O2

void free_nodes(min_heap *to_expand)

{
  pointer ppnVar1;
  
  while (ppnVar1 = (to_expand->c).super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
                   super__Vector_impl_data._M_start,
        ppnVar1 !=
        (to_expand->c).super__Vector_base<node_*,_std::allocator<node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
    operator_delete(*ppnVar1);
    std::priority_queue<node_*,_std::vector<node_*,_std::allocator<node_*>_>,_Compare>::pop
              (to_expand);
  }
  return;
}

Assistant:

void free_nodes(min_heap& to_expand){
    while(!to_expand.empty()){
        node* old_node = to_expand.top();
        delete old_node;
        to_expand.pop();
    }
}